

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

void Curl_hsts_loadfiles(Curl_easy *data)

{
  curl_slist *local_18;
  curl_slist *l;
  Curl_easy *data_local;
  
  local_18 = (data->state).hstslist;
  if (local_18 != (curl_slist *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_HSTS,CURL_LOCK_ACCESS_SINGLE);
    for (; local_18 != (curl_slist *)0x0; local_18 = local_18->next) {
      Curl_hsts_loadfile(data,data->hsts,local_18->data);
    }
    Curl_share_unlock(data,CURL_LOCK_DATA_HSTS);
  }
  return;
}

Assistant:

void Curl_hsts_loadfiles(struct Curl_easy *data)
{
  struct curl_slist *l = data->state.hstslist;
  if(l) {
    Curl_share_lock(data, CURL_LOCK_DATA_HSTS, CURL_LOCK_ACCESS_SINGLE);

    while(l) {
      (void)Curl_hsts_loadfile(data, data->hsts, l->data);
      l = l->next;
    }
    Curl_share_unlock(data, CURL_LOCK_DATA_HSTS);
  }
}